

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O1

void jinit_memory_mgr(j_common_ptr cinfo)

{
  int iVar1;
  jpeg_memory_mgr *pjVar2;
  char *pcVar3;
  char ch;
  long max_to_use;
  long local_18;
  
  cinfo->mem = (jpeg_memory_mgr *)0x0;
  local_18 = jpeg_mem_init(cinfo);
  pjVar2 = (jpeg_memory_mgr *)jpeg_get_small(cinfo,0xa8);
  if (pjVar2 == (jpeg_memory_mgr *)0x0) {
    jpeg_mem_term(cinfo);
    *(undefined8 *)&cinfo->err->msg_code = 0x38;
    (*cinfo->err->error_exit)(cinfo);
  }
  pjVar2->alloc_small = alloc_small;
  pjVar2->alloc_large = alloc_large;
  pjVar2->alloc_sarray = alloc_sarray;
  pjVar2->alloc_barray = alloc_barray;
  pjVar2->request_virt_sarray = request_virt_sarray;
  pjVar2->request_virt_barray = request_virt_barray;
  pjVar2->realize_virt_arrays = realize_virt_arrays;
  pjVar2->access_virt_sarray = access_virt_sarray;
  pjVar2->access_virt_barray = access_virt_barray;
  pjVar2->free_pool = free_pool;
  pjVar2->self_destruct = self_destruct;
  pjVar2->max_alloc_chunk = 1000000000;
  pjVar2->max_memory_to_use = local_18;
  pjVar2[1].alloc_small = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
  pjVar2[1].alloc_large = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
  pjVar2[1].alloc_sarray = (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0;
  pjVar2[1].alloc_barray = (_func_JBLOCKARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0;
  pjVar2[1].request_virt_sarray =
       (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
  pjVar2[1].request_virt_barray =
       (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
  pjVar2[1].realize_virt_arrays = (_func_void_j_common_ptr *)0xa8;
  cinfo->mem = pjVar2;
  pcVar3 = getenv("JPEGMEM");
  if ((pcVar3 != (char *)0x0) && (iVar1 = __isoc99_sscanf(pcVar3,"%ld%c",&local_18), 0 < iVar1)) {
    pjVar2->max_memory_to_use = local_18 * 1000;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_memory_mgr (j_common_ptr cinfo)
{
  my_mem_ptr mem;
  long max_to_use;
  int pool;
  size_t test_mac;

  cinfo->mem = NULL;		/* for safety if init fails */

  /* Check for configuration errors.
   * SIZEOF(ALIGN_TYPE) should be a power of 2; otherwise, it probably
   * doesn't reflect any real hardware alignment requirement.
   * The test is a little tricky: for X>0, X and X-1 have no one-bits
   * in common if and only if X is a power of 2, ie has only one one-bit.
   * Some compilers may give an "unreachable code" warning here; ignore it.
   */
  if ((SIZEOF(ALIGN_TYPE) & (SIZEOF(ALIGN_TYPE)-1)) != 0)
    ERREXIT(cinfo, JERR_BAD_ALIGN_TYPE);
  /* MAX_ALLOC_CHUNK must be representable as type size_t, and must be
   * a multiple of SIZEOF(ALIGN_TYPE).
   * Again, an "unreachable code" warning may be ignored here.
   * But a "constant too large" warning means you need to fix MAX_ALLOC_CHUNK.
   */
  test_mac = (size_t) MAX_ALLOC_CHUNK;
  if ((long) test_mac != MAX_ALLOC_CHUNK ||
      (MAX_ALLOC_CHUNK % SIZEOF(ALIGN_TYPE)) != 0)
    ERREXIT(cinfo, JERR_BAD_ALLOC_CHUNK);

  max_to_use = jpeg_mem_init(cinfo); /* system-dependent initialization */

  /* Attempt to allocate memory manager's control block */
  mem = (my_mem_ptr) jpeg_get_small(cinfo, SIZEOF(my_memory_mgr));

  if (mem == NULL) {
    jpeg_mem_term(cinfo);	/* system-dependent cleanup */
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 0);
  }

  /* OK, fill in the method pointers */
  mem->pub.alloc_small = alloc_small;
  mem->pub.alloc_large = alloc_large;
  mem->pub.alloc_sarray = alloc_sarray;
  mem->pub.alloc_barray = alloc_barray;
  mem->pub.request_virt_sarray = request_virt_sarray;
  mem->pub.request_virt_barray = request_virt_barray;
  mem->pub.realize_virt_arrays = realize_virt_arrays;
  mem->pub.access_virt_sarray = access_virt_sarray;
  mem->pub.access_virt_barray = access_virt_barray;
  mem->pub.free_pool = free_pool;
  mem->pub.self_destruct = self_destruct;

  /* Make MAX_ALLOC_CHUNK accessible to other modules */
  mem->pub.max_alloc_chunk = MAX_ALLOC_CHUNK;

  /* Initialize working state */
  mem->pub.max_memory_to_use = max_to_use;

  for (pool = JPOOL_NUMPOOLS-1; pool >= JPOOL_PERMANENT; pool--) {
    mem->small_list[pool] = NULL;
    mem->large_list[pool] = NULL;
  }
  mem->virt_sarray_list = NULL;
  mem->virt_barray_list = NULL;

  mem->total_space_allocated = SIZEOF(my_memory_mgr);

  /* Declare ourselves open for business */
  cinfo->mem = & mem->pub;

  /* Check for an environment variable JPEGMEM; if found, override the
   * default max_memory setting from jpeg_mem_init.  Note that the
   * surrounding application may again override this value.
   * If your system doesn't support getenv(), define NO_GETENV to disable
   * this feature.
   */
#ifndef NO_GETENV
  { char * memenv;

    if ((memenv = getenv("JPEGMEM")) != NULL) {
      char ch = 'x';

      if (sscanf(memenv, "%ld%c", &max_to_use, &ch) > 0) {
	if (ch == 'm' || ch == 'M')
	  max_to_use *= 1000L;
	mem->pub.max_memory_to_use = max_to_use * 1000L;
      }
    }
  }
#endif

}